

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall
amrex::MLMG::checkPoint
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_rhs,
          Real a_tol_rel,Real a_tol_abs,char *a_file_name)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FabArray<amrex::FArrayBox> *pFVar3;
  MLLinOp *pMVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  uint uVar15;
  undefined8 uVar16;
  uint uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string HeaderFileName;
  string __str_1;
  string file_name;
  ofstream HeaderFile;
  string local_2f0;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  string local_2b0;
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  string local_270;
  Real local_250;
  Real local_248;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_240;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_238;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  local_250 = a_tol_abs;
  local_248 = a_tol_rel;
  local_240 = a_rhs;
  local_238 = a_sol;
  std::__cxx11::string::string((string *)&local_270,a_file_name,(allocator *)local_230);
  UtilCreateCleanDirectory(&local_270,false);
  if (*(int *)(DAT_00842950 + -0x3c) == *(int *)(DAT_00842950 + -0x30)) {
    std::__cxx11::string::string((string *)local_230,a_file_name,(allocator *)&local_2f0);
    puVar8 = (undefined8 *)std::__cxx11::string::append(local_230);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2b0.field_2._M_allocated_capacity = *psVar11;
      local_2b0.field_2._8_8_ = puVar8[3];
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar11;
      local_2b0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2b0._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    std::ofstream::ofstream(local_230);
    std::ofstream::open(local_230,(_Ios_Openmode)local_2b0._M_dataplus._M_p);
    if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) {
      FileOpenFailed(&local_2b0);
    }
    *(undefined8 *)((long)&local_228 + *(long *)((long)local_230 + -0x18)) = 0x11;
    (*this->linop->_vptr_MLLinOp[2])(&local_2f0);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"a_tol_rel = ",0xc);
    poVar9 = std::ostream::_M_insert<double>(local_248);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"a_tol_abs = ",0xc);
    poVar9 = std::ostream::_M_insert<double>(local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"verbose = ",10);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->verbose);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max_iters = ",0xc);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->max_iters);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"nu1 = ",6);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->nu1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"nu2 = ",6);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->nu2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"nuf = ",6);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->nuf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"nub = ",6);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->nub);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max_fmg_iters = ",0x10);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->max_fmg_iters);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"bottom_solver = ",0x10);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->bottom_solver);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"bottom_verbose = ",0x11);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->bottom_verbose);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"bottom_maxiter = ",0x11);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->bottom_maxiter);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"bottom_reltol = ",0x10);
    poVar9 = std::ostream::_M_insert<double>(this->bottom_reltol);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"always_use_bnorm = ",0x13);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->always_use_bnorm);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"namrlevs = ",0xb);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->namrlevs);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"finest_amr_lev = ",0x11);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->finest_amr_lev);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"linop_prepared = ",0x11);
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"solve_called = ",0xf);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    paVar2 = &local_2f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (-1 < this->finest_amr_lev) {
      uVar17 = 0;
      do {
        local_2d0 = local_2c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,local_270._M_dataplus._M_p,
                   local_270._M_dataplus._M_p + local_270._M_string_length);
        std::__cxx11::string::append((char *)&local_2d0);
        uVar15 = 1;
        if (9 < uVar17) {
          uVar12 = (ulong)uVar17;
          uVar7 = 4;
          do {
            uVar15 = uVar7;
            uVar6 = (uint)uVar12;
            if (uVar6 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_0064afee;
            }
            if (uVar6 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_0064afee;
            }
            if (uVar6 < 10000) goto LAB_0064afee;
            uVar12 = uVar12 / 10000;
            uVar7 = uVar15 + 4;
          } while (99999 < uVar6);
          uVar15 = uVar15 + 1;
        }
LAB_0064afee:
        local_290 = local_280;
        std::__cxx11::string::_M_construct((ulong)&local_290,(char)uVar15);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_290,uVar15,uVar17);
        uVar12 = 0xf;
        if (local_2d0 != local_2c0) {
          uVar12 = local_2c0[0];
        }
        if (uVar12 < (ulong)(local_288 + local_2c8)) {
          uVar12 = 0xf;
          if (local_290 != local_280) {
            uVar12 = local_280[0];
          }
          if (uVar12 < (ulong)(local_288 + local_2c8)) goto LAB_0064b05a;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
        }
        else {
LAB_0064b05a:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290);
        }
        puVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1) {
          local_2f0.field_2._M_allocated_capacity = *puVar1;
          local_2f0.field_2._8_8_ = puVar8[3];
          local_2f0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar1;
          local_2f0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2f0._M_string_length = puVar8[1];
        *puVar8 = puVar1;
        puVar8[1] = 0;
        *(undefined1 *)puVar1 = 0;
        UtilCreateCleanDirectory(&local_2f0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_290 != local_280) {
          operator_delete(local_290,local_280[0] + 1);
        }
        if (local_2d0 != local_2c0) {
          operator_delete(local_2d0,local_2c0[0] + 1);
        }
        bVar5 = (int)uVar17 < this->finest_amr_lev;
        uVar17 = uVar17 + 1;
      } while (bVar5);
    }
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (-1 < this->finest_amr_lev) {
    paVar2 = &local_2b0.field_2;
    uVar12 = 0;
    do {
      pFVar3 = &(local_238->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12]->super_FabArray<amrex::FArrayBox>;
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_270._M_dataplus._M_p,
                 local_270._M_dataplus._M_p + local_270._M_string_length);
      std::__cxx11::string::append((char *)&local_2f0);
      uVar17 = 1;
      if (9 < uVar12) {
        uVar15 = 4;
        uVar13 = uVar12;
        do {
          uVar17 = uVar15;
          uVar7 = (uint)uVar13;
          if (uVar7 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0064b22f;
          }
          if (uVar7 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0064b22f;
          }
          if (uVar7 < 10000) goto LAB_0064b22f;
          uVar13 = (uVar13 & 0xffffffff) / 10000;
          uVar15 = uVar17 + 4;
        } while (99999 < uVar7);
        uVar17 = uVar17 + 1;
      }
LAB_0064b22f:
      local_2d0 = local_2c0;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2d0,uVar17,(uint)uVar12);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        uVar16 = local_2f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_2c8 + local_2f0._M_string_length) {
        uVar13 = 0xf;
        if (local_2d0 != local_2c0) {
          uVar13 = local_2c0[0];
        }
        if (uVar13 < local_2c8 + local_2f0._M_string_length) goto LAB_0064b2a5;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
      }
      else {
LAB_0064b2a5:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_2d0);
      }
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0.field_2._8_8_ = puVar8[3];
        local_2b0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)psVar11 = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_230 = (undefined1  [8])&local_220;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar14) {
        local_220._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_220._8_8_ = plVar10[3];
      }
      else {
        local_220._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_230 = (undefined1  [8])*plVar10;
      }
      local_228 = plVar10[1];
      *plVar10 = (long)paVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      VisMF::Write(pFVar3,(string *)local_230,NFiles,false);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != local_2c0) {
        operator_delete(local_2d0,local_2c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      pFVar3 = &(local_240->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar12]->super_FabArray<amrex::FArrayBox>;
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_270._M_dataplus._M_p,
                 local_270._M_dataplus._M_p + local_270._M_string_length);
      std::__cxx11::string::append((char *)&local_2f0);
      uVar17 = 1;
      if (9 < uVar12) {
        uVar15 = 4;
        uVar13 = uVar12;
        do {
          uVar17 = uVar15;
          uVar7 = (uint)uVar13;
          if (uVar7 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0064b488;
          }
          if (uVar7 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0064b488;
          }
          if (uVar7 < 10000) goto LAB_0064b488;
          uVar13 = (uVar13 & 0xffffffff) / 10000;
          uVar15 = uVar17 + 4;
        } while (99999 < uVar7);
        uVar17 = uVar17 + 1;
      }
LAB_0064b488:
      local_2d0 = local_2c0;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2d0,uVar17,(uint)uVar12);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        uVar16 = local_2f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_2c8 + local_2f0._M_string_length) {
        uVar13 = 0xf;
        if (local_2d0 != local_2c0) {
          uVar13 = local_2c0[0];
        }
        if (uVar13 < local_2c8 + local_2f0._M_string_length) goto LAB_0064b4fe;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
      }
      else {
LAB_0064b4fe:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_2d0);
      }
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0.field_2._8_8_ = puVar8[3];
        local_2b0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)psVar11 = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_230 = (undefined1  [8])&local_220;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar14) {
        local_220._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_220._8_8_ = plVar10[3];
      }
      else {
        local_220._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_230 = (undefined1  [8])*plVar10;
      }
      local_228 = plVar10[1];
      *plVar10 = (long)paVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      VisMF::Write(pFVar3,(string *)local_230,NFiles,false);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != local_2c0) {
        operator_delete(local_2d0,local_2c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      bVar5 = (long)uVar12 < (long)this->finest_amr_lev;
      uVar12 = uVar12 + 1;
    } while (bVar5);
  }
  pMVar4 = this->linop;
  local_230 = (undefined1  [8])&local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,local_270._M_dataplus._M_p,
             local_270._M_dataplus._M_p + local_270._M_string_length);
  std::__cxx11::string::append(local_230);
  (*pMVar4->_vptr_MLLinOp[0x44])(pMVar4,local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
MLMG::checkPoint (const Vector<MultiFab*>& a_sol, const Vector<MultiFab const*>& a_rhs,
                  Real a_tol_rel, Real a_tol_abs, const char* a_file_name) const
{
    std::string file_name(a_file_name);
    UtilCreateCleanDirectory(file_name, false);

    if (ParallelContext::IOProcessorSub())
    {
        std::string HeaderFileName(std::string(a_file_name)+"/Header");
        std::ofstream HeaderFile;
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                std::ofstream::trunc |
                                                std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        HeaderFile.precision(17);

        HeaderFile << linop.name() << "\n"
                   << "a_tol_rel = " << a_tol_rel << "\n"
                   << "a_tol_abs = " << a_tol_abs << "\n"
                   << "verbose = " << verbose << "\n"
                   << "max_iters = " << max_iters << "\n"
                   << "nu1 = " << nu1 << "\n"
                   << "nu2 = " << nu2 << "\n"
                   << "nuf = " << nuf << "\n"
                   << "nub = " << nub << "\n"
                   << "max_fmg_iters = " << max_fmg_iters << "\n"
                   << "bottom_solver = " << static_cast<int>(bottom_solver) << "\n"
                   << "bottom_verbose = " << bottom_verbose << "\n"
                   << "bottom_maxiter = " << bottom_maxiter << "\n"
                   << "bottom_reltol = " << bottom_reltol << "\n"
                   << "always_use_bnorm = " << always_use_bnorm << "\n"
                   << "namrlevs = " << namrlevs << "\n"
                   << "finest_amr_lev = " << finest_amr_lev << "\n"
                   << "linop_prepared = " << linop_prepared << "\n"
                   << "solve_called = " << solve_called << "\n";

        for (int ilev = 0; ilev <= finest_amr_lev; ++ilev) {
            UtilCreateCleanDirectory(file_name+"/Level_"+std::to_string(ilev), false);
        }
    }

    ParallelContext::BarrierSub();

    for (int ilev = 0; ilev <= finest_amr_lev; ++ilev) {
        VisMF::Write(*a_sol[ilev], file_name+"/Level_"+std::to_string(ilev)+"/sol");
        VisMF::Write(*a_rhs[ilev], file_name+"/Level_"+std::to_string(ilev)+"/rhs");
    }

    linop.checkPoint(file_name+"/linop");
}